

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_text.cpp
# Opt level: O0

void __thiscall Am_Font_Data::Am_Font_Data(Am_Font_Data *this,Am_Font_Data *proto)

{
  size_t sVar1;
  char *pcVar2;
  Am_Font_Data *proto_local;
  Am_Font_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_004116c0;
  this->family = proto->family;
  this->bold = (bool)(proto->bold & 1);
  this->italic = (bool)(proto->italic & 1);
  this->underline = (bool)(proto->underline & 1);
  this->size = proto->size;
  if (proto->name == (char *)0x0) {
    this->name = (char *)0x0;
  }
  else {
    sVar1 = strlen(proto->name);
    pcVar2 = (char *)operator_new__(sVar1 + 1);
    this->name = pcVar2;
    strcpy(this->name,proto->name);
  }
  this->main_xfont = (XFontStruct *)0x0;
  this->main_display = (Display *)0x0;
  this->font_head = (Font_Index *)0x0;
  this->char_width = 0;
  this->next = list;
  list = this;
  return;
}

Assistant:

Am_Font_Data::Am_Font_Data(Am_Font_Data *proto)
{
  family = proto->family;
  bold = proto->bold;
  italic = proto->italic;
  underline = proto->underline;
  size = proto->size;
  if (proto->name) {
    name = new char[strlen(proto->name) + 1];
    strcpy(name, proto->name);
  } else
    name = nullptr;
  main_xfont = nullptr;
  main_display = nullptr;
  font_head = nullptr;
  char_width = 0;
  next = list;
  list = this;
}